

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O3

void __thiscall
ktx::CommandCreate::processOptions(CommandCreate *this,Options *opts,ParseResult *args)

{
  Reporter *report;
  size_t sVar1;
  CommandCreate *pCVar2;
  bool bVar3;
  _Storage<unsigned_int,_true> _Var4;
  int iVar5;
  OptionValue *pOVar6;
  undefined8 uVar7;
  char *pcVar8;
  _Storage<unsigned_int,_true> _Var9;
  VkFormat format;
  BasisCodec BVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  VkFormat VVar11;
  ulong uVar12;
  long lVar13;
  string_view fmt;
  string_view fmt_00;
  format_args args_00;
  format_args args_01;
  char *astcOption;
  string local_98;
  string local_78;
  ulong local_58 [3];
  Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
  *local_40;
  CommandCreate *local_38;
  
  local_40 = &this->options;
  report = &(this->super_Command).super_Reporter;
  Combine<ktx::OptionsCreate,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<false>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsMultiInSingleOut,_ktx::OptionsGeneric>
  ::process(local_40,opts,args,report);
  _Var4._M_value = 1;
  _Var9._M_value = 1;
  if ((this->options).super_OptionsCreate.levels.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged != false) {
    _Var9 = (this->options).super_OptionsCreate.levels.
            super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload;
  }
  this->numLevels = (uint32_t)_Var9;
  _Var9._M_value = 1;
  if ((this->options).super_OptionsCreate.layers.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged != false) {
    _Var9 = (this->options).super_OptionsCreate.layers.
            super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload;
  }
  this->numLayers = (uint32_t)_Var9;
  bVar3 = (this->options).super_OptionsCreate.cubemap;
  this->numFaces = (uint)bVar3 + (uint)bVar3 * 4 + 1;
  if ((this->options).super_OptionsCreate.depth.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged != false) {
    _Var4 = (this->options).super_OptionsCreate.depth.super__Optional_base<unsigned_int,_true,_true>
            ._M_payload.super__Optional_payload_base<unsigned_int>._M_payload;
  }
  this->baseDepth = (uint32_t)_Var4;
  if ((this->options).super_OptionsCreate.raw == true) {
    checkNumInputImages(this);
  }
  bVar3 = isFormatAstc((this->options).super_OptionsCreate.vkFormat);
  local_38 = this;
  if (bVar3) {
    (this->options).super_OptionsEncodeASTC.super_ktxAstcParams.threadCount =
         (this->options).super_OptionsEncodeCommon.threadCount;
    (this->options).super_OptionsEncodeASTC.super_ktxAstcParams.normalMap =
         (this->options).super_OptionsEncodeCommon.normalMap;
    if ((this->options).super_OptionsEncodeCommon.noSSE == true) {
      Reporter::fatal_usage<char_const(&)[37],char_const*&>
                (report,(char (*) [37])"--{} is not allowed with ASTC encode",
                 &OptionsEncodeCommon::kNoSse);
    }
  }
  else {
    lVar13 = 0;
    do {
      local_78._M_dataplus._M_p = *(pointer *)((long)OptionsEncodeASTC::kAstcOptions + lVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,local_78._M_dataplus._M_p,(allocator<char> *)local_58);
      pOVar6 = cxxopts::ParseResult::operator[](args,&local_98);
      sVar1 = pOVar6->m_count;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (sVar1 != 0) {
        Reporter::fatal_usage<char_const(&)[41],char_const*&>
                  (report,(char (*) [41])"--{} can only be used with ASTC formats.",
                   (char **)&local_78);
      }
      lVar13 = lVar13 + 8;
    } while (lVar13 != 0x10);
  }
  pCVar2 = local_38;
  BVar10 = (local_38->options).super_OptionsEncodeBasis<false>.codec;
  if (BVar10 == BasisLZ) {
    if ((local_38->options).super_OptionsDeflate.zstd.super__Optional_base<unsigned_int,_true,_true>
        ._M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      Reporter::fatal_usage<char_const(&)[54]>
                (report,(char (*) [54])"Cannot encode to BasisLZ and supercompress with Zstd.");
    }
    if ((pCVar2->options).super_OptionsDeflate.zlib.super__Optional_base<unsigned_int,_true,_true>.
        _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      Reporter::fatal_usage<char_const(&)[54]>
                (report,(char (*) [54])"Cannot encode to BasisLZ and supercompress with ZLIB.");
    }
    BVar10 = (pCVar2->options).super_OptionsEncodeBasis<false>.codec;
  }
  VVar11 = (pCVar2->options).super_OptionsCreate.vkFormat;
  uVar12 = (ulong)VVar11;
  if (BVar10 == NONE) {
    bVar3 = isFormatAstc(VVar11);
LAB_00154ed7:
    if ((bVar3 == false) && ((pCVar2->options).super_OptionsEncodeCommon.field_0x29 != '\0')) {
      Reporter::fatal_usage<char_const(&)[70]>
                (report,(char (*) [70])
                        "--compare-ssim can only be used with BasisLZ, UASTC or ASTC encoding.");
    }
    if (bVar3 == false && (pCVar2->options).super_OptionsEncodeCommon.field_0x2a == '\x01') {
      Reporter::fatal_usage<char_const(&)[70]>
                (report,(char (*) [70])
                        "--compare-psnr can only be used with BasisLZ, UASTC or ASTC encoding.");
    }
  }
  else {
    if ((VK_FORMAT_R8G8B8A8_SRGB < VVar11) || ((0x82020c18200U >> (uVar12 & 0x3f) & 1) == 0)) {
      pcVar8 = (char *)vkFormatString(uVar12);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,pcVar8,(allocator<char> *)local_58);
      iVar5 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar5 == 0) {
        fmt.size_ = 2;
        fmt.data_ = (char *)0xa;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)local_58;
        local_58[0] = uVar12;
        ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)0x20aba6,fmt,args_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p == &local_98.field_2) {
          local_78.field_2._8_8_ = local_98.field_2._8_8_;
        }
        else {
          local_78._M_dataplus._M_p = local_98._M_dataplus._M_p;
        }
        local_78.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
        local_78._M_string_length = local_98._M_string_length;
      }
      Reporter::fatal_usage<char_const(&)[86],std::__cxx11::string>
                (report,(char (*) [86])
                        "Only R8, RG8, RGB8, or RGBA8 UNORM and SRGB formats can be encoded, but format is {}."
                 ,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      BVar10 = (pCVar2->options).super_OptionsEncodeBasis<false>.codec;
      VVar11 = (pCVar2->options).super_OptionsCreate.vkFormat;
    }
    bVar3 = isFormatAstc(VVar11);
    if (1 < BVar10 - BasisLZ) goto LAB_00154ed7;
    (pCVar2->options).super_OptionsEncodeBasis<false>.super_ktxBasisParams.threadCount =
         (pCVar2->options).super_OptionsEncodeCommon.threadCount;
    (pCVar2->options).super_OptionsEncodeBasis<false>.super_ktxBasisParams.normalMap =
         (pCVar2->options).super_OptionsEncodeCommon.normalMap;
    (pCVar2->options).super_OptionsEncodeBasis<false>.super_ktxBasisParams.noSSE =
         (pCVar2->options).super_OptionsEncodeCommon.noSSE;
  }
  bVar3 = isFormatAstc((pCVar2->options).super_OptionsCreate.vkFormat);
  if ((bVar3) && ((pCVar2->options).super_OptionsCreate.raw == false)) {
    (pCVar2->options).super_OptionsEncodeASTC.encodeASTC = true;
    VVar11 = (pCVar2->options).super_OptionsCreate.vkFormat;
    switch(VVar11) {
    case VK_FORMAT_ASTC_4x4_UNORM_BLOCK:
    case VK_FORMAT_ASTC_4x4_SRGB_BLOCK:
      uVar7 = 0x100000000;
      break;
    case VK_FORMAT_ASTC_5x4_UNORM_BLOCK:
    case VK_FORMAT_ASTC_5x4_SRGB_BLOCK:
      uVar7 = 0x100000001;
      break;
    case VK_FORMAT_ASTC_5x5_UNORM_BLOCK:
    case VK_FORMAT_ASTC_5x5_SRGB_BLOCK:
      uVar7 = 0x100000002;
      break;
    case VK_FORMAT_ASTC_6x5_UNORM_BLOCK:
    case VK_FORMAT_ASTC_6x5_SRGB_BLOCK:
      uVar7 = 0x100000003;
      break;
    case VK_FORMAT_ASTC_6x6_UNORM_BLOCK:
    case VK_FORMAT_ASTC_6x6_SRGB_BLOCK:
      uVar7 = 0x100000004;
      break;
    case VK_FORMAT_ASTC_8x5_UNORM_BLOCK:
    case VK_FORMAT_ASTC_8x5_SRGB_BLOCK:
      uVar7 = 0x100000005;
      break;
    case VK_FORMAT_ASTC_8x6_UNORM_BLOCK:
    case VK_FORMAT_ASTC_8x6_SRGB_BLOCK:
      uVar7 = 0x100000006;
      break;
    case VK_FORMAT_ASTC_8x8_UNORM_BLOCK:
    case VK_FORMAT_ASTC_8x8_SRGB_BLOCK:
      uVar7 = 0x100000009;
      break;
    case VK_FORMAT_ASTC_10x5_UNORM_BLOCK:
    case VK_FORMAT_ASTC_10x5_SRGB_BLOCK:
      uVar7 = 0x100000007;
      break;
    case VK_FORMAT_ASTC_10x6_UNORM_BLOCK:
    case VK_FORMAT_ASTC_10x6_SRGB_BLOCK:
      uVar7 = 0x100000008;
      break;
    case VK_FORMAT_ASTC_10x8_UNORM_BLOCK:
    case VK_FORMAT_ASTC_10x8_SRGB_BLOCK:
      uVar7 = 0x10000000a;
      break;
    case VK_FORMAT_ASTC_10x10_UNORM_BLOCK:
    case VK_FORMAT_ASTC_10x10_SRGB_BLOCK:
      uVar7 = 0x10000000b;
      break;
    case VK_FORMAT_ASTC_12x10_UNORM_BLOCK:
    case VK_FORMAT_ASTC_12x10_SRGB_BLOCK:
      uVar7 = 0x10000000c;
      break;
    case VK_FORMAT_ASTC_12x12_UNORM_BLOCK:
    case VK_FORMAT_ASTC_12x12_SRGB_BLOCK:
      uVar7 = 0x10000000d;
      break;
    default:
      toString_abi_cxx11_(&local_98,(ktx *)(ulong)VVar11,format);
      Reporter::fatal<char_const(&)[37],std::__cxx11::string>
                (report,NOT_SUPPORTED,(char (*) [37])"{} is unsupported for ASTC encoding.",
                 &local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001550bb;
    }
    (pCVar2->options).super_OptionsEncodeASTC.super_ktxAstcParams.blockDimension = (int)uVar7;
    (pCVar2->options).super_OptionsEncodeASTC.super_ktxAstcParams.mode = (int)((ulong)uVar7 >> 0x20)
    ;
  }
LAB_001550bb:
  if (((local_40->super_OptionsCreate)._1d == true) &&
     ((pCVar2->options).super_OptionsEncodeASTC.encodeASTC == true)) {
    VVar11 = (pCVar2->options).super_OptionsCreate.vkFormat;
    pcVar8 = (char *)vkFormatString(VVar11);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,pcVar8,(allocator<char> *)local_58);
    iVar5 = std::__cxx11::string::compare((char *)&local_98);
    if (iVar5 == 0) {
      fmt_00.size_ = 2;
      fmt_00.data_ = (char *)0xa;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_58;
      local_58[0] = (ulong)VVar11;
      ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)0x20aba6,fmt_00,args_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_98.field_2) {
        local_78.field_2._8_8_ = local_98.field_2._8_8_;
      }
      else {
        local_78._M_dataplus._M_p = local_98._M_dataplus._M_p;
      }
      local_78.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
      local_78._M_string_length = local_98._M_string_length;
    }
    Reporter::fatal_usage<char_const(&)[78],std::__cxx11::string>
              (report,(char (*) [78])
                      "ASTC format {} cannot be used for 1 dimensional textures (indicated by --1d)."
               ,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CommandCreate::processOptions(cxxopts::Options& opts, cxxopts::ParseResult& args) {
    options.process(opts, args, *this);

    numLevels = options.levels.value_or(1);
    numLayers = options.layers.value_or(1);
    numFaces = options.cubemap ? 6 : 1;
    baseDepth = options.depth.value_or(1u);

    if (options.raw) {
        // options.levels <= max for dimensions was checked in CreateOptions::process
        checkNumInputImages();
    }

    if (!isFormatAstc(options.vkFormat)) {
        for (const char* astcOption : OptionsEncodeASTC::kAstcOptions)
            if (args[astcOption].count())
                fatal_usage("--{} can only be used with ASTC formats.", astcOption);
    } else {
        fillOptionsCodecAstc<decltype(options)>(options);
        if (options.OptionsEncodeCommon::noSSE)
            fatal_usage("--{} is not allowed with ASTC encode", OptionsEncodeCommon::kNoSse);
    }

    if (options.codec == BasisCodec::BasisLZ) {
        if (options.zstd.has_value())
            fatal_usage("Cannot encode to BasisLZ and supercompress with Zstd.");

        if (options.zlib.has_value())
            fatal_usage("Cannot encode to BasisLZ and supercompress with ZLIB.");
    }

    if (options.codec != BasisCodec::NONE) {
        switch (options.vkFormat) {
        case VK_FORMAT_R8_UNORM:
        case VK_FORMAT_R8_SRGB:
        case VK_FORMAT_R8G8_UNORM:
        case VK_FORMAT_R8G8_SRGB:
        case VK_FORMAT_R8G8B8_UNORM:
        case VK_FORMAT_R8G8B8_SRGB:
        case VK_FORMAT_R8G8B8A8_UNORM:
        case VK_FORMAT_R8G8B8A8_SRGB:
            // Allowed formats
            break;
        default:
            fatal_usage("Only R8, RG8, RGB8, or RGBA8 UNORM and SRGB formats can be encoded, "
                "but format is {}.", toString(VkFormat(options.vkFormat)));
            break;
        }
    }

    const auto basisCodec = options.codec == BasisCodec::BasisLZ || options.codec == BasisCodec::UASTC;
    const auto astcCodec = isFormatAstc(options.vkFormat);
    const auto canCompare = basisCodec || astcCodec;

    if (basisCodec)
        fillOptionsCodecBasis<decltype(options)>(options);

    if (options.compare_ssim && !canCompare)
        fatal_usage("--compare-ssim can only be used with BasisLZ, UASTC or ASTC encoding.");
    if (options.compare_psnr && !canCompare)
        fatal_usage("--compare-psnr can only be used with BasisLZ, UASTC or ASTC encoding.");

    if (isFormatAstc(options.vkFormat) && !options.raw) {
        options.encodeASTC = true;

        switch (options.vkFormat) {
        case VK_FORMAT_ASTC_4x4_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_4x4_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_4x4;
            break;
        case VK_FORMAT_ASTC_5x4_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_5x4_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_5x4;
            break;
        case VK_FORMAT_ASTC_5x5_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_5x5_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_5x5;
            break;
        case VK_FORMAT_ASTC_6x5_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_6x5_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_6x5;
            break;
        case VK_FORMAT_ASTC_6x6_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_6x6_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_6x6;
            break;
        case VK_FORMAT_ASTC_8x5_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_8x5_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_8x5;
            break;
        case VK_FORMAT_ASTC_8x6_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_8x6_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_8x6;
            break;
        case VK_FORMAT_ASTC_8x8_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_8x8_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_8x8;
            break;
        case VK_FORMAT_ASTC_10x5_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_10x5_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_10x5;
            break;
        case VK_FORMAT_ASTC_10x6_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_10x6_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_10x6;
            break;
        case VK_FORMAT_ASTC_10x8_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_10x8_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_10x8;
            break;
        case VK_FORMAT_ASTC_10x10_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_10x10_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_10x10;
            break;
        case VK_FORMAT_ASTC_12x10_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_12x10_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_12x10;
            break;
        case VK_FORMAT_ASTC_12x12_UNORM_BLOCK: [[fallthrough]];
        case VK_FORMAT_ASTC_12x12_SRGB_BLOCK:
            options.mode = KTX_PACK_ASTC_ENCODER_MODE_LDR;
            options.blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_12x12;
            break;
        default:
            fatal(rc::NOT_SUPPORTED, "{} is unsupported for ASTC encoding.", toString(options.vkFormat));
            break;
        }
    }

    if (options._1d && options.encodeASTC)
        fatal_usage("ASTC format {} cannot be used for 1 dimensional textures (indicated by --1d).",
                toString(options.vkFormat));

}